

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O1

void __thiscall
nuraft::raft_server::auto_fwd_release_rpc_cli
          (raft_server *this,ptr<auto_fwd_pkg> *cur_pkg,ptr<rpc_client> *rpc_cli)

{
  uint uVar1;
  _List_node_base *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  int iVar5;
  unique_lock<std::mutex> ll;
  rpc_handler handler;
  unique_lock<std::mutex> l;
  auto_fwd_req_resp entry;
  ptr<raft_params> params;
  anon_class_32_4_602b9eac put_back_to_idle_list;
  unique_lock<std::mutex> local_108;
  undefined8 *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *pcStack_e0;
  unique_lock<std::mutex> local_d8;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  raft_server *local_88;
  _List_node_base *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
  local_68;
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  context::get_params((context *)local_58);
  uVar1 = *(uint *)((long)&((element_type *)(local_58._0_8_ + 0x48))->_vptr_state_mgr + 4);
  iVar5 = *(int *)&((element_type *)(local_58._0_8_ + 0x58))->_vptr_state_mgr;
  local_38 = (element_type *)0x1;
  if (1 < (int)uVar1) {
    local_38 = (element_type *)(ulong)uVar1;
  }
  local_d8._M_device =
       &((cur_pkg->super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr)->lock_;
  local_d8._M_owns = false;
  local_58._16_8_ = cur_pkg;
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)rpc_cli;
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::unique_lock<std::mutex>::lock(&local_d8);
  local_d8._M_owns = true;
  if (iVar5 == 0) {
    auto_fwd_release_rpc_cli::anon_class_32_4_602b9eac::operator()
              ((anon_class_32_4_602b9eac *)(local_58 + 0x10));
    EventAwaiter::invoke
              (&((cur_pkg->
                 super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->ea_);
  }
  else {
    local_108._M_device = &this->auto_fwd_reqs_lock_;
    local_108._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_108);
    local_108._M_owns = true;
    p_Var2 = (this->auto_fwd_reqs_).
             super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->auto_fwd_reqs_) {
      std::unique_lock<std::mutex>::unlock(&local_108);
      auto_fwd_release_rpc_cli::anon_class_32_4_602b9eac::operator()
                ((anon_class_32_4_602b9eac *)(local_58 + 0x10));
    }
    else {
      local_78 = p_Var2[1]._M_next;
      local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[1]._M_prev;
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_70->_M_use_count = local_70->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_70->_M_use_count = local_70->_M_use_count + 1;
        }
      }
      local_68.
      super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)p_Var2[2]._M_next;
      local_68.
      super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[2]._M_prev;
      if (local_68.
          super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68.
           super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_68.
                super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68.
           super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_68.
                super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::__cxx11::
      list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
      ::_M_erase(&this->auto_fwd_reqs_,
                 (this->auto_fwd_reqs_).
                 super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                 ._M_impl._M_node.super__List_node_base._M_next);
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) && (iVar5 = (*peVar3->_vptr_logger[7])(), 5 < iVar5)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_c8,"found waiting request in the queue, remaining elems %zu",
                   (this->auto_fwd_reqs_).
                   super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                   ._M_impl._M_node._M_size);
        (*peVar3->_vptr_logger[8])
                  (peVar3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                   ,"auto_fwd_release_rpc_cli",0x137,(string *)local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._0_8_ != &((string *)local_c8)->field_2) {
          operator_delete((void *)local_c8._0_8_);
        }
      }
      std::unique_lock<std::mutex>::unlock(&local_108);
      local_c8._0_8_ = auto_fwd_resp_handler;
      local_c8._8_8_ = 0;
      std::
      _Tuple_impl<1ul,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>>
      ::
      _Tuple_impl<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>&,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>&,std::shared_ptr<nuraft::rpc_client>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,void>
                ((_Tuple_impl<1ul,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>>
                  *)&((string *)local_c8)->field_2,&local_68,cur_pkg,rpc_cli,
                 (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2
                );
      local_f8 = (undefined8 *)0x0;
      uStack_f0 = 0;
      local_e8 = (code *)0x0;
      pcStack_e0 = (code *)0x0;
      local_88 = this;
      local_f8 = (undefined8 *)operator_new(0x48);
      *local_f8 = local_c8._0_8_;
      local_f8[1] = local_c8._8_8_;
      local_f8[3] = 0;
      local_f8[2] = local_b8._M_allocated_capacity;
      local_f8[3] = local_b8._8_8_;
      local_f8[5] = 0;
      local_f8[4] = local_a8;
      local_f8[5] = uStack_a0;
      local_f8[7] = 0;
      local_f8[6] = local_98;
      local_f8[7] = uStack_90;
      local_f8[8] = local_88;
      uStack_90 = 0;
      local_98 = 0;
      uStack_a0 = 0;
      local_a8 = 0;
      local_b8._8_8_ = 0;
      local_b8._M_allocated_capacity = 0;
      pcStack_e0 = std::
                   _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
                   ::_M_invoke;
      local_e8 = std::
                 _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
                 ::_M_manager;
      std::unique_lock<std::mutex>::unlock(&local_d8);
      peVar4 = (rpc_cli->super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar4->_vptr_rpc_client[2])
                (peVar4,&local_78,&local_f8,
                 (long)*(int *)((long)&((element_type *)(local_58._0_8_ + 0x58))->_vptr_state_mgr +
                               4));
      if (local_e8 != (code *)0x0) {
        (*local_e8)(&local_f8,&local_f8,3);
      }
      if (local_68.
          super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.
                   super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_108);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_d8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return;
}

Assistant:

void raft_server::auto_fwd_release_rpc_cli( ptr<auto_fwd_pkg> cur_pkg,
                                            ptr<rpc_client> rpc_cli )
{
    ptr<raft_params> params = ctx_->get_params();
    size_t max_conns =
        std::max(1, params->auto_forwarding_max_connections_);
    bool is_blocking_mode = (params->return_method_ == raft_params::blocking);

    auto put_back_to_idle_list = [&cur_pkg, &rpc_cli, max_conns, this]() {
        cur_pkg->rpc_client_in_use_.erase(rpc_cli);
        cur_pkg->rpc_client_idle_.push_front(rpc_cli);
        p_tr( "release connection %p, idle %zu, in-use %zu, max %zu",
              rpc_cli.get(),
              cur_pkg->rpc_client_idle_.size(),
              cur_pkg->rpc_client_in_use_.size(),
              max_conns );
    };

    std::unique_lock<std::mutex> l(cur_pkg->lock_);
    if (is_blocking_mode) {
        // Blocking mode, put the connection back to idle list,
        // and wake up the sleeping thread.
        put_back_to_idle_list();
        cur_pkg->ea_.invoke();

    } else {
        // Async mode, send the request in the queue.
        std::unique_lock<std::mutex> ll(auto_fwd_reqs_lock_);
        if (!auto_fwd_reqs_.empty()) {
            auto_fwd_req_resp entry = *auto_fwd_reqs_.begin();
            auto_fwd_reqs_.pop_front();
            p_tr( "found waiting request in the queue, remaining elems %zu",
                  auto_fwd_reqs_.size() );
            ll.unlock();

            rpc_handler handler = std::bind( &raft_server::auto_fwd_resp_handler,
                                             this,
                                             entry.resp,
                                             cur_pkg,
                                             rpc_cli,
                                             std::placeholders::_1,
                                             std::placeholders::_2 );

            // Should be unlocked before calling `send`, as resp handler can be
            // invoked in the same thread in case of error.
            l.unlock();
            rpc_cli->send(entry.req, handler, params->auto_forwarding_req_timeout_);

        } else {
            // If no request is waiting, put the connection back to idle list.
            ll.unlock();
            put_back_to_idle_list();
        }
    }
}